

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

uint32_t rgbcx::bc1_find_sels3_fullerr
                   (bool use_black,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint8_t uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint32_t i;
  long lVar24;
  uint uVar25;
  uint uVar26;
  
  uVar21 = lr >> 2 | lr * 8;
  uVar5 = lg >> 4 | lg * 4;
  uVar6 = lb >> 2 | lb * 8;
  uVar7 = hr >> 2 | hr * 8;
  uVar18 = hg >> 4 | hg * 4;
  uVar26 = hb >> 2 | hb * 8;
  if (g_bc1_approx_mode != 3) {
    if (g_bc1_approx_mode == 2) {
      uVar8 = (int)(uVar7 + uVar21 + 1) >> 1;
      uVar25 = (int)(uVar18 + uVar5 + 1) >> 1;
      uVar9 = (int)(uVar26 + uVar6 + 1) >> 1;
      goto LAB_0011f678;
    }
    if (g_bc1_approx_mode != 0) {
      iVar13 = (hr + lr) * 0x21;
      iVar14 = (hr + lr) * 0x21 + 7;
      if (-1 < iVar13) {
        iVar14 = iVar13;
      }
      uVar8 = iVar14 >> 3;
      iVar14 = uVar18 - uVar5;
      iVar13 = iVar14 + 3;
      if (-1 < iVar14) {
        iVar13 = iVar14;
      }
      iVar13 = (iVar13 >> 2) + uVar5 * 0x100;
      iVar22 = iVar14 * 0x80 + iVar13 + 0x80;
      iVar13 = iVar14 * 0x80 + iVar13 + 0x17f;
      if (-1 < iVar22) {
        iVar13 = iVar22;
      }
      uVar25 = iVar13 >> 8;
      iVar13 = (hb + lb) * 0x21;
      iVar14 = (hb + lb) * 0x21 + 7;
      if (-1 < iVar13) {
        iVar14 = iVar13;
      }
      uVar9 = iVar14 >> 3;
      goto LAB_0011f678;
    }
  }
  uVar8 = uVar7 + uVar21 >> 1;
  uVar25 = uVar18 + uVar5 >> 1;
  uVar9 = uVar26 + uVar6 >> 1;
LAB_0011f678:
  lVar24 = 0;
  uVar4 = 0;
  while( true ) {
    bVar1 = pSrc_pixels[lVar24].field_0.field_0.r;
    bVar2 = pSrc_pixels[lVar24].field_0.field_0.g;
    bVar3 = pSrc_pixels[lVar24].field_0.field_0.b;
    iVar13 = uVar21 - bVar1;
    iVar22 = uVar5 - bVar2;
    iVar14 = uVar6 - bVar3;
    uVar15 = iVar14 * iVar14 + iVar22 * iVar22 + iVar13 * iVar13;
    iVar22 = uVar7 - bVar1;
    iVar13 = uVar18 - bVar2;
    iVar14 = uVar26 - bVar3;
    uVar19 = iVar14 * iVar14 + iVar13 * iVar13 + iVar22 * iVar22;
    uVar11 = uVar19;
    if (uVar19 >= uVar15) {
      uVar11 = uVar15;
    }
    uVar23 = (uint)bVar1;
    uVar12 = (uint)bVar2;
    uVar10 = (uint)bVar3;
    uVar16 = (uVar9 - uVar10) * (uVar9 - uVar10) +
             (uVar25 - uVar12) * (uVar25 - uVar12) + (uVar8 - uVar23) * (uVar8 - uVar23);
    uVar17 = uVar16;
    if (uVar11 <= uVar16) {
      uVar17 = uVar11;
    }
    uVar20 = uVar19 < uVar15;
    if (uVar11 > uVar16) {
      uVar20 = '\x02';
    }
    if ((use_black) &&
       (uVar11 = uVar10 * uVar10 + uVar12 * uVar12 + uVar23 * uVar23, uVar11 < uVar17)) {
      uVar20 = '\x03';
      uVar17 = uVar11;
    }
    uVar4 = uVar4 + uVar17;
    if (cur_err <= uVar4) break;
    sels[lVar24] = uVar20;
    lVar24 = lVar24 + 1;
    if (lVar24 == 0x10) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

static inline uint32_t bc1_find_sels3_fullerr(bool use_black, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t block_r[3], block_g[3], block_b[3];
		bc1_get_block_colors3(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);
								
		uint32_t total_err = 0;

		for (uint32_t i = 0; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r;
			const int g = pSrc_pixels[i].g;
			const int b = pSrc_pixels[i].b;

			uint32_t best_err = squarei((int)block_r[0] - (int)r) + squarei((int)block_g[0] - (int)g) + squarei((int)block_b[0] - (int)b);
			uint32_t best_sel = 0;

			uint32_t err1 = squarei((int)block_r[1] - (int)r) + squarei((int)block_g[1] - (int)g) + squarei((int)block_b[1] - (int)b);
			if (err1 < best_err)
			{
				best_err = err1;
				best_sel = 1;
			}

			uint32_t err2 = squarei((int)block_r[2] - (int)r) + squarei((int)block_g[2] - (int)g) + squarei((int)block_b[2] - (int)b);
			if (err2 < best_err)
			{
				best_err = err2;
				best_sel = 2;
			}

			if (use_black)
			{
				uint32_t err3 = squarei(r) + squarei(g) + squarei(b);
				if (err3 < best_err)
				{
					best_err = err3;
					best_sel = 3;
				}
			}
			
			total_err += best_err;
			if (total_err >= cur_err)
				return total_err;
			
			sels[i] = (uint8_t)best_sel;
		}

		return total_err;
	}